

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall QPDFJob::doJSONPages(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  _Atomic_word *p_Var1;
  QPDFPageLabelDocumentHelper *this_00;
  QPDFObjectHandle *this_01;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  QPDFObjGen og;
  undefined1 auVar6 [8];
  QPDFOutlineObjectHelper *this_02;
  int iVar7;
  int i;
  int iVar8;
  bool first_page;
  QPDFObjectHandle decode_parms;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> outlines;
  JSON j_contents;
  QPDFObjectHandle dict;
  JSON j_outlines;
  JSON j_page;
  QPDFObjectHandle page;
  JSON j_images;
  QPDFOutlineDocumentHelper odh;
  QPDFPageLabelDocumentHelper pldh;
  undefined1 local_2d8 [39];
  bool local_2b1;
  undefined1 local_2b0 [8];
  undefined1 local_2a8 [40];
  QPDFJob *local_280;
  undefined1 local_278 [24];
  element_type *local_260;
  undefined1 local_258 [40];
  element_type *local_230;
  undefined1 local_228 [32];
  _Base_ptr local_208;
  string local_200;
  JSON local_1e0;
  QPDFObjectHandle local_1d0;
  JSON local_1c0;
  QPDFPageObjectHelper *local_1b0;
  long local_1a8;
  element_type *local_1a0;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_198;
  JSON local_180;
  JSON local_170;
  JSON local_160;
  JSON local_150;
  JSON local_140;
  JSON local_130;
  JSON local_120;
  JSON local_110;
  JSON local_100;
  JSON local_f0;
  JSON local_e0;
  JSON local_d0;
  JSON local_c0;
  JSON local_b0;
  JSON local_a0;
  JSON local_90;
  JSON local_80;
  QPDFOutlineDocumentHelper local_70;
  QPDFPageLabelDocumentHelper local_50;
  
  local_2b0 = (undefined1  [8])(local_2b0 + 0x10);
  local_280 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"pages","");
  local_200.field_2._M_allocated_capacity = (size_type)p;
  JSON::writeDictionaryKey(p,first,(string *)local_2b0,1);
  if (local_2b0 != (undefined1  [8])(local_2b0 + 0x10)) {
    operator_delete((void *)local_2b0,local_2a8._8_8_ + 1);
  }
  local_2b1 = true;
  JSON::writeArrayOpen((Pipeline *)local_200.field_2._M_allocated_capacity,&local_2b1,2);
  QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper(&local_50,pdf);
  QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper(&local_70,pdf);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_2b0,pdf);
  QPDFPageDocumentHelper::getAllPages(&local_198,(QPDFPageDocumentHelper *)local_2b0);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_2b0);
  local_228._16_8_ =
       local_198.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1b0 = local_198.
              super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_198.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_198.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_200.field_2._8_8_ = -1;
    this_00 = (QPDFPageLabelDocumentHelper *)(local_278 + 0x10);
    this_01 = (QPDFObjectHandle *)(local_258 + 0x10);
    do {
      JSON::makeDictionary();
      local_1d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (((BaseHandle *)(local_228._16_8_ + 8))->obj).
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228._16_8_ + 0x10))->_M_pi;
      if (local_1d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_1d0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_1d0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      local_2b0 = (undefined1  [8])(local_2b0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"object","");
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)local_2d8,(int)&local_1d0,
                 SUB41(((local_280->m).
                        super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       json_version,0));
      JSON::addDictionaryMember(&local_80,&local_200,(JSON *)local_2b0);
      if (local_80.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
      }
      if (local_2b0 != (undefined1  [8])(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0,local_2a8._8_8_ + 1);
      }
      local_2b0 = (undefined1  [8])(local_2b0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"images","");
      JSON::makeArray();
      JSON::addDictionaryMember(&local_1c0,&local_200,(JSON *)local_2b0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
      }
      if (local_2b0 != (undefined1  [8])(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0,local_2a8._8_8_ + 1);
      }
      QPDFPageObjectHelper::getImages_abi_cxx11_
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  *)local_2b0,(QPDFPageObjectHelper *)local_228._16_8_);
      for (p_Var5 = (_Rb_tree_node_base *)local_2a8._16_8_;
          p_Var5 != (_Rb_tree_node_base *)(local_2b0 + 8);
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        JSON::makeDictionary();
        JSON::addArrayElement((JSON *)(local_258 + 0x20),&local_1c0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
        }
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"name","");
        JSON::makeString((JSON *)this_00,(string *)(p_Var5 + 1));
        JSON::addDictionaryMember(&local_90,(string *)(local_258 + 0x20),(JSON *)local_2d8);
        if (local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_260 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260);
        }
        if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        local_228._24_8_ = *(undefined8 *)(p_Var5 + 2);
        local_208 = p_Var5[2]._M_parent;
        if (local_208 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&local_208->_M_parent = *(int *)&local_208->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&local_208->_M_parent = *(int *)&local_208->_M_parent + 1;
          }
        }
        QPDFObjectHandle::getDict((QPDFObjectHandle *)local_228);
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"object","");
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)this_00,(int)local_228 + 0x18,
                   SUB41(((local_280->m).
                          super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         json_version,0));
        JSON::addDictionaryMember(&local_a0,(string *)(local_258 + 0x20),(JSON *)local_2d8);
        if (local_a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_260 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260);
        }
        if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"width","");
        local_278._16_8_ = local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"/Width","");
        QPDFObjectHandle::getKey(this_01,(string *)local_228);
        iVar7 = (int)this_01;
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)local_278,iVar7,
                   SUB41(((local_280->m).
                          super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         json_version,0));
        JSON::addDictionaryMember(&local_b0,(string *)(local_258 + 0x20),(JSON *)local_2d8);
        if (local_b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
        }
        if ((element_type *)local_258._24_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._24_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258) {
          operator_delete((void *)local_278._16_8_,(ulong)((long)(_func_int ***)local_258._0_8_ + 1)
                         );
        }
        if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"height","");
        local_278._16_8_ = local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"/Height","");
        QPDFObjectHandle::getKey(this_01,(string *)local_228);
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)local_278,iVar7,
                   SUB41(((local_280->m).
                          super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         json_version,0));
        JSON::addDictionaryMember(&local_c0,(string *)(local_258 + 0x20),(JSON *)local_2d8);
        if (local_c0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
        }
        if ((element_type *)local_258._24_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._24_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258) {
          operator_delete((void *)local_278._16_8_,(ulong)((long)(_func_int ***)local_258._0_8_ + 1)
                         );
        }
        if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"colorspace","");
        local_278._16_8_ = local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"/ColorSpace","");
        QPDFObjectHandle::getKey(this_01,(string *)local_228);
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)local_278,iVar7,
                   SUB41(((local_280->m).
                          super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         json_version,0));
        JSON::addDictionaryMember(&local_d0,(string *)(local_258 + 0x20),(JSON *)local_2d8);
        if (local_d0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
        }
        if ((element_type *)local_258._24_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._24_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258) {
          operator_delete((void *)local_278._16_8_,(ulong)((long)(_func_int ***)local_258._0_8_ + 1)
                         );
        }
        if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"bitspercomponent","");
        local_278._16_8_ = local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"/BitsPerComponent","");
        QPDFObjectHandle::getKey(this_01,(string *)local_228);
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)local_278,iVar7,
                   SUB41(((local_280->m).
                          super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         json_version,0));
        JSON::addDictionaryMember(&local_e0,(string *)(local_258 + 0x20),(JSON *)local_2d8);
        if (local_e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
        }
        if ((element_type *)local_258._24_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._24_8_);
        }
        if ((QPDFOutlineObjectHelper *)local_278._16_8_ != (QPDFOutlineObjectHelper *)local_258) {
          operator_delete((void *)local_278._16_8_,(ulong)((long)(_func_int ***)local_258._0_8_ + 1)
                         );
        }
        if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"/Filter","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_278,(string *)local_228);
        QPDFObjectHandle::wrapInArray((QPDFObjectHandle *)this_00);
        if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
        }
        if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"filter","");
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)local_278,(int)this_00,
                   SUB41(((local_280->m).
                          super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         json_version,0));
        JSON::addDictionaryMember(&local_f0,(string *)(local_258 + 0x20),(JSON *)local_2d8);
        if (local_f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
        }
        if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"/DecodeParms","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_278,(string *)local_228);
        if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        local_258._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_258._24_8_ = (element_type *)0x0;
        bVar3 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_278);
        if (bVar3) {
          local_258._16_8_ = local_278._0_8_;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258 + 0x18),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_278 + 8));
        }
        else {
          QPDFObjectHandle::newArray();
          uVar2 = local_258._24_8_;
          local_258._24_8_ = local_2d8._8_8_;
          local_258._16_8_ = local_2d8._0_8_;
          local_2d8._0_8_ = (element_type *)0x0;
          local_2d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((element_type *)uVar2 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
            }
          }
          iVar8 = 0;
          while( true ) {
            iVar4 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)this_00);
            if (iVar4 <= iVar8) break;
            QPDFObjectHandle::appendItem(this_01,(QPDFObjectHandle *)local_278);
            iVar8 = iVar8 + 1;
          }
        }
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"decodeparms","");
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)&local_1e0,iVar7,
                   SUB41(((local_280->m).
                          super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         json_version,0));
        JSON::addDictionaryMember(&local_100,(string *)(local_258 + 0x20),(JSON *)local_2d8);
        if (local_100.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_100.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_1e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"filterable","");
        bVar3 = QPDFObjectHandle::pipeStreamData
                          ((QPDFObjectHandle *)(local_228 + 0x18),(Pipeline *)0x0,0,
                           ((local_280->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->decode_level,true,false);
        JSON::makeBool(&local_1e0,bVar3);
        JSON::addDictionaryMember(&local_110,(string *)(local_258 + 0x20),(JSON *)local_2d8);
        if (local_110.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_110.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_1e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        if ((element_type *)local_258._24_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._24_8_);
        }
        if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
        }
        if (local_260 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
        }
        if (local_208 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208);
        }
        if (local_230 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                   *)local_2b0);
      local_2b0 = (undefined1  [8])(local_2b0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"images","");
      JSON::addDictionaryMember(&local_120,&local_200,(JSON *)local_2b0);
      if (local_120.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_120.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_2b0 != (undefined1  [8])(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0,local_2a8._8_8_ + 1);
      }
      local_2b0 = (undefined1  [8])(local_2b0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"contents","");
      JSON::makeArray();
      JSON::addDictionaryMember((JSON *)(local_258 + 0x20),&local_200,(JSON *)local_2b0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
      }
      if (local_2b0 != (undefined1  [8])(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0,local_2a8._8_8_ + 1);
      }
      QPDFPageObjectHelper::getPageContents
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2b0,
                 (QPDFPageObjectHelper *)local_228._16_8_);
      uVar2 = local_2a8._0_8_;
      for (auVar6 = local_2b0; auVar6 != (undefined1  [8])uVar2;
          auVar6 = (undefined1  [8])((long)auVar6 + 0x10)) {
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)local_2d8,SUB84(auVar6,0),
                   SUB41(((local_280->m).
                          super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         json_version,0));
        JSON::addArrayElement(&local_130,(JSON *)(local_258 + 0x20));
        if (local_130.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_130.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
        }
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2b0);
      local_2b0 = (undefined1  [8])(local_2b0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"label","");
      local_1a8 = local_200.field_2._8_8_ + 1;
      QPDFPageLabelDocumentHelper::getLabelForPage(this_00,(longlong)&local_50);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)local_2d8,(int)this_00,
                 SUB41(((local_280->m).
                        super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       json_version,0));
      JSON::addDictionaryMember(&local_140,&local_200,(JSON *)local_2b0);
      if (local_140.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_140.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
      }
      if (local_260 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260);
      }
      if (local_2b0 != (undefined1  [8])(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0,local_2a8._8_8_ + 1);
      }
      local_2b0 = (undefined1  [8])(local_2b0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"outlines","");
      JSON::makeArray();
      JSON::addDictionaryMember((JSON *)(local_228 + 0x18),&local_200,(JSON *)local_2b0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
      }
      if (local_2b0 != (undefined1  [8])(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0,local_2a8._8_8_ + 1);
      }
      og = QPDFObjectHandle::getObjGen(&local_1d0);
      QPDFOutlineDocumentHelper::getOutlinesForPage
                ((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)
                 this_00,&local_70,og);
      local_1a0 = local_260;
      this_02 = (QPDFOutlineObjectHelper *)local_278._16_8_;
      if ((element_type *)local_278._16_8_ != local_260) {
        do {
          JSON::makeDictionary();
          JSON::addArrayElement((JSON *)local_228,(JSON *)(local_228 + 0x18));
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._0_8_);
          }
          local_2b0 = (undefined1  [8])(local_2b0 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"object","");
          local_278._0_8_ =
               (this_02->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_278._8_8_ =
               (this_02->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = (_Atomic_word *)
                       ((long)&(((element_type *)local_278._8_8_)->value).
                               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       + 8);
              *p_Var1 = *p_Var1 + 1;
              UNLOCK();
            }
            else {
              p_Var1 = (_Atomic_word *)
                       ((long)&(((element_type *)local_278._8_8_)->value).
                               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       + 8);
              *p_Var1 = *p_Var1 + 1;
            }
          }
          iVar7 = (int)(QPDFOutlineObjectHelper *)local_278;
          QPDFObjectHandle::getJSON
                    ((QPDFObjectHandle *)local_2d8,iVar7,
                     SUB41(((local_280->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->json_version,0));
          JSON::addDictionaryMember(&local_150,(string *)local_228,(JSON *)local_2b0);
          if (local_150.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_150.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
          }
          if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
          }
          if (local_2b0 != (undefined1  [8])(local_2b0 + 0x10)) {
            operator_delete((void *)local_2b0,local_2a8._8_8_ + 1);
          }
          local_2b0 = (undefined1  [8])(local_2b0 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"title","");
          QPDFOutlineObjectHelper::getTitle_abi_cxx11_((string *)local_2d8,this_02);
          JSON::makeString((JSON *)local_278,(string *)local_2d8);
          JSON::addDictionaryMember(&local_160,(string *)local_228,(JSON *)local_2b0);
          if (local_160.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_160.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
          }
          if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
            operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
          }
          if (local_2b0 != (undefined1  [8])(local_2b0 + 0x10)) {
            operator_delete((void *)local_2b0,local_2a8._8_8_ + 1);
          }
          local_2b0 = (undefined1  [8])(local_2b0 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"dest","");
          QPDFOutlineObjectHelper::getDest((QPDFOutlineObjectHelper *)local_278);
          QPDFObjectHandle::getJSON
                    ((QPDFObjectHandle *)local_2d8,iVar7,
                     SUB41(((local_280->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->json_version,0));
          JSON::addDictionaryMember(&local_170,(string *)local_228,(JSON *)local_2b0);
          if (local_170.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_170.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
          }
          if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
          }
          if (local_2b0 != (undefined1  [8])(local_2b0 + 0x10)) {
            operator_delete((void *)local_2b0,local_2a8._8_8_ + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
          }
          this_02 = this_02 + 1;
        } while ((element_type *)this_02 != local_1a0);
      }
      local_2b0 = (undefined1  [8])(local_2b0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"pageposfrom1","");
      JSON::makeInt((JSON *)local_2d8,local_200.field_2._8_8_ + 2);
      JSON::addDictionaryMember(&local_180,&local_200,(JSON *)local_2b0);
      if (local_180.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_180.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
      }
      if (local_2b0 != (undefined1  [8])(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0,local_2a8._8_8_ + 1);
      }
      JSON::writeArrayItem
                ((Pipeline *)local_200.field_2._M_allocated_capacity,&local_2b1,(JSON *)&local_200,2
                );
      std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
                ((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)
                 this_00);
      if (local_208 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208);
      }
      if (local_230 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230);
      }
      if (local_1c0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1c0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_1d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._M_string_length);
      }
      local_228._16_8_ = local_228._16_8_ + 0x38;
      local_200.field_2._8_8_ = local_1a8;
    } while ((QPDFPageObjectHelper *)local_228._16_8_ != local_1b0);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_198);
  JSON::writeArrayClose((Pipeline *)local_200.field_2._M_allocated_capacity,local_2b1,1);
  QPDFOutlineDocumentHelper::~QPDFOutlineDocumentHelper(&local_70);
  QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper(&local_50);
  return;
}

Assistant:

void
QPDFJob::doJSONPages(Pipeline* p, bool& first, QPDF& pdf)
{
    JSON::writeDictionaryKey(p, first, "pages", 1);
    bool first_page = true;
    JSON::writeArrayOpen(p, first_page, 2);
    QPDFPageLabelDocumentHelper pldh(pdf);
    QPDFOutlineDocumentHelper odh(pdf);
    int pageno = -1;
    for (auto& ph: QPDFPageDocumentHelper(pdf).getAllPages()) {
        ++pageno;
        JSON j_page = JSON::makeDictionary();
        QPDFObjectHandle page = ph.getObjectHandle();
        j_page.addDictionaryMember("object", page.getJSON(m->json_version));
        JSON j_images = j_page.addDictionaryMember("images", JSON::makeArray());
        for (auto const& iter2: ph.getImages()) {
            JSON j_image = j_images.addArrayElement(JSON::makeDictionary());
            j_image.addDictionaryMember("name", JSON::makeString(iter2.first));
            QPDFObjectHandle image = iter2.second;
            QPDFObjectHandle dict = image.getDict();
            j_image.addDictionaryMember("object", image.getJSON(m->json_version));
            j_image.addDictionaryMember("width", dict.getKey("/Width").getJSON(m->json_version));
            j_image.addDictionaryMember("height", dict.getKey("/Height").getJSON(m->json_version));
            j_image.addDictionaryMember(
                "colorspace", dict.getKey("/ColorSpace").getJSON(m->json_version));
            j_image.addDictionaryMember(
                "bitspercomponent", dict.getKey("/BitsPerComponent").getJSON(m->json_version));
            QPDFObjectHandle filters = dict.getKey("/Filter").wrapInArray();
            j_image.addDictionaryMember("filter", filters.getJSON(m->json_version));
            QPDFObjectHandle decode_parms = dict.getKey("/DecodeParms");
            QPDFObjectHandle dp_array;
            if (decode_parms.isArray()) {
                dp_array = decode_parms;
            } else {
                dp_array = QPDFObjectHandle::newArray();
                for (int i = 0; i < filters.getArrayNItems(); ++i) {
                    dp_array.appendItem(decode_parms);
                }
            }
            j_image.addDictionaryMember("decodeparms", dp_array.getJSON(m->json_version));
            j_image.addDictionaryMember(
                "filterable",
                JSON::makeBool(image.pipeStreamData(nullptr, 0, m->decode_level, true)));
        }
        j_page.addDictionaryMember("images", j_images);
        JSON j_contents = j_page.addDictionaryMember("contents", JSON::makeArray());
        for (auto& iter2: ph.getPageContents()) {
            j_contents.addArrayElement(iter2.getJSON(m->json_version));
        }
        j_page.addDictionaryMember("label", pldh.getLabelForPage(pageno).getJSON(m->json_version));
        JSON j_outlines = j_page.addDictionaryMember("outlines", JSON::makeArray());
        std::vector<QPDFOutlineObjectHelper> outlines = odh.getOutlinesForPage(page.getObjGen());
        for (auto& oiter: outlines) {
            JSON j_outline = j_outlines.addArrayElement(JSON::makeDictionary());
            j_outline.addDictionaryMember(
                "object", oiter.getObjectHandle().getJSON(m->json_version));
            j_outline.addDictionaryMember("title", JSON::makeString(oiter.getTitle()));
            j_outline.addDictionaryMember("dest", oiter.getDest().getJSON(m->json_version, true));
        }
        j_page.addDictionaryMember("pageposfrom1", JSON::makeInt(1 + pageno));
        JSON::writeArrayItem(p, first_page, j_page, 2);
    }
    JSON::writeArrayClose(p, first_page, 1);
}